

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

PhysicalDeviceDetails * get_physical_device_details(VkPhysicalDevice physicalDevice)

{
  size_type sVar1;
  reference ppVVar2;
  reference pvVar3;
  ulong local_18;
  size_t i;
  VkPhysicalDevice physicalDevice_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::size
                      (&mock.physical_device_handles);
    if (sVar1 <= local_18) {
      __assert_fail("false && \"should never reach here!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/tests/vulkan_mock.cpp"
                    ,0x72,
                    "VulkanMock::PhysicalDeviceDetails &get_physical_device_details(VkPhysicalDevice)"
                   );
    }
    ppVVar2 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::operator[]
                        (&mock.physical_device_handles,local_18);
    if (*ppVVar2 == physicalDevice) break;
    local_18 = local_18 + 1;
  }
  pvVar3 = std::
           vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ::operator[](&mock.physical_devices_details,local_18);
  return pvVar3;
}

Assistant:

VulkanMock::PhysicalDeviceDetails& get_physical_device_details(VkPhysicalDevice physicalDevice) {
    for (size_t i = 0; i < mock.physical_device_handles.size(); i++) {
        if (mock.physical_device_handles[i] == physicalDevice) return mock.physical_devices_details[i];
    }
    assert(false && "should never reach here!");
    return mock.physical_devices_details.front();
}